

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::MoveFileIfDifferent(string *source,string *destination)

{
  bool bVar1;
  string *destination_local;
  string *source_local;
  
  bVar1 = cmsys::SystemTools::FilesDiffer(source,destination);
  if (bVar1) {
    bVar1 = RenameFile(source,destination);
    if (bVar1) {
      return;
    }
    cmsys::SystemTools::CopyFileAlways(source,destination);
  }
  cmsys::SystemTools::RemoveFile(source);
  return;
}

Assistant:

void cmSystemTools::MoveFileIfDifferent(const std::string& source,
                                        const std::string& destination)
{
  if (FilesDiffer(source, destination)) {
    if (RenameFile(source, destination)) {
      return;
    }
    CopyFileAlways(source, destination);
  }
  RemoveFile(source);
}